

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

void __thiscall cfd::core::HashUtil::HashUtil(HashUtil *this,uint8_t hash_type)

{
  uint8_t uVar1;
  long lVar2;
  CfdException *this_00;
  string local_50;
  
  this->_vptr_HashUtil = (_func_int **)&PTR__HashUtil_007e5bd8;
  this->hash_type_ = hash_type;
  ByteData::ByteData(&this->buffer_);
  lVar2 = -0xf0;
  while( true ) {
    uVar1 = *(uint8_t *)((long)&RandomNumberUtil::GetRandomBytes::rd.field_0 + lVar2);
    if ((uVar1 == hash_type) || (uVar1 == '\0')) break;
    lVar2 = lVar2 + 0x28;
    if (lVar2 == 0) {
LAB_0043eb91:
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"unknown hash type.","")
      ;
      CfdException::CfdException(this_00,kCfdInternalError,&local_50);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  if (uVar1 != '\0') {
    return;
  }
  goto LAB_0043eb91;
}

Assistant:

HashUtil::HashUtil(uint8_t hash_type) : hash_type_(hash_type) {
  for (const auto &item : kFormatList) {
    if (item.type == 0) break;
    if (hash_type == item.type) return;
  }
  throw CfdException(kCfdInternalError, "unknown hash type.");
}